

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_tri_ideal(REF_GRID ref_grid,REF_INT node,REF_INT tri,REF_DBL *ideal_location)

{
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  long lVar4;
  REF_INT node_00;
  int node_01;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  REF_DBL dn [3];
  REF_DBL dt [3];
  REF_DBL m [6];
  REF_DBL log_m [6];
  REF_DBL log_m2 [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  REF_INT nodes [27];
  double local_1d8 [3];
  REF_NODE local_1c0;
  double local_1b8 [4];
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  REF_DBL local_168 [6];
  REF_DBL local_138 [6];
  REF_DBL local_108 [6];
  REF_DBL local_d8 [6];
  int local_a8;
  int local_a4;
  int local_a0;
  
  pRVar1 = ref_grid->node;
  uVar3 = ref_cell_nodes(ref_grid->cell[3],tri,&local_a8);
  if (uVar3 == 0) {
    node_01 = -1;
    if (local_a8 == node) {
      node_01 = local_a0;
    }
    node_00 = -1;
    if (local_a8 == node) {
      node_00 = local_a4;
    }
    if (local_a4 == node) {
      node_00 = local_a0;
      node_01 = local_a8;
    }
    if (local_a0 == node) {
      node_00 = local_a8;
      node_01 = local_a4;
    }
    if ((node_00 == -1) || (node_01 == -1)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x12d,"ref_smooth_tri_ideal","empty triangle side");
      uVar3 = 1;
    }
    else {
      pRVar2 = pRVar1->real;
      lVar4 = 0;
      do {
        ideal_location[lVar4] =
             (pRVar2[node_00 * 0xf + lVar4] + pRVar2[node_01 * 0xf + lVar4]) * 0.5;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      pRVar2 = pRVar1->real;
      lVar4 = 0;
      do {
        local_1d8[lVar4] = pRVar2[node * 0xf + lVar4] - ideal_location[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      pRVar2 = pRVar1->real;
      lVar4 = 0;
      do {
        local_1b8[lVar4] = pRVar2[node_01 * 0xf + lVar4] - pRVar2[node_00 * 0xf + lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      dVar6 = local_1b8[2] * local_1b8[2] +
              local_1b8[0] * local_1b8[0] + local_1b8[1] * local_1b8[1];
      dVar5 = local_1b8[2] * local_1d8[2] +
              local_1b8[0] * local_1d8[0] + local_1b8[1] * local_1d8[1];
      dVar8 = dVar6 * 1e+20;
      if (dVar8 <= -dVar8) {
        dVar8 = -dVar8;
      }
      dVar7 = -dVar5;
      if (dVar5 <= dVar7) {
        dVar5 = dVar7;
      }
      if (dVar8 <= dVar5) {
        printf("projection = %e tangent_length = %e\n");
      }
      else {
        lVar4 = 0;
        do {
          local_1d8[lVar4] = local_1b8[lVar4] * (dVar7 / dVar6) + local_1d8[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        local_1c0 = pRVar1;
        uVar3 = ref_math_normalize(local_1d8);
        pRVar1 = local_1c0;
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x143,"ref_smooth_tri_ideal",(ulong)uVar3,"normalize direction");
          return uVar3;
        }
        uVar3 = ref_node_metric_get_log(local_1c0,node_00,local_d8);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x146,"ref_smooth_tri_ideal",(ulong)uVar3,"get n0 log m");
          return uVar3;
        }
        uVar3 = ref_node_metric_get_log(pRVar1,node_01,local_108);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x147,"ref_smooth_tri_ideal",(ulong)uVar3,"get n1 log m");
          return uVar3;
        }
        uVar3 = ref_node_metric_get_log(pRVar1,node,local_138);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x148,"ref_smooth_tri_ideal",(ulong)uVar3,"get node log m");
          return uVar3;
        }
        lVar4 = 0;
        do {
          local_168[lVar4] = (local_d8[lVar4] + local_108[lVar4] + local_138[lVar4]) / 3.0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 6);
        uVar3 = ref_matrix_exp_m(local_168,&local_198);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x14a,"ref_smooth_tri_ideal",(ulong)uVar3,"exp avg");
          return uVar3;
        }
        dVar8 = (local_170 * local_1d8[2] + local_188 * local_1d8[0] + local_1d8[1] * local_178) *
                local_1d8[2] +
                (local_188 * local_1d8[2] + local_198 * local_1d8[0] + local_190 * local_1d8[1]) *
                local_1d8[0] +
                (local_178 * local_1d8[2] + local_190 * local_1d8[0] + local_180 * local_1d8[1]) *
                local_1d8[1];
        if (dVar8 < 0.0) {
          dVar8 = sqrt(dVar8);
        }
        else {
          dVar8 = SQRT(dVar8);
        }
        dVar5 = dVar8 * 1e+20;
        if (dVar5 <= -dVar5) {
          dVar5 = -dVar5;
        }
        if (0.8660254037844386 < dVar5) {
          lVar4 = 0;
          do {
            ideal_location[lVar4] =
                 local_1d8[lVar4] * (0.8660254037844386 / dVar8) + ideal_location[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 3);
          return 0;
        }
        printf(" length_in_metric = %e, not invertible\n");
      }
      uVar3 = 4;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x11e,
           "ref_smooth_tri_ideal",(ulong)uVar3,"get tri");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_ideal(REF_GRID ref_grid, REF_INT node,
                                        REF_INT tri, REF_DBL *ideal_location) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT n0, n1;
  REF_INT ixyz, i;
  REF_DBL dn[3];
  REF_DBL dt[3];
  REF_DBL log_m0[6], log_m1[6], log_m2[6], log_m[6];
  REF_DBL m[6];
  REF_DBL tangent_length, projection, scale, length_in_metric;

  RSS(ref_cell_nodes(ref_grid_tri(ref_grid), tri, nodes), "get tri");
  n0 = REF_EMPTY;
  n1 = REF_EMPTY;
  if (node == nodes[0]) {
    n0 = nodes[1];
    n1 = nodes[2];
  }
  if (node == nodes[1]) {
    n0 = nodes[2];
    n1 = nodes[0];
  }
  if (node == nodes[2]) {
    n0 = nodes[0];
    n1 = nodes[1];
  }
  if (n0 == REF_EMPTY || n1 == REF_EMPTY) THROW("empty triangle side");

  for (ixyz = 0; ixyz < 3; ixyz++)
    ideal_location[ixyz] = 0.5 * (ref_node_xyz(ref_node, ixyz, n0) +
                                  ref_node_xyz(ref_node, ixyz, n1));
  for (ixyz = 0; ixyz < 3; ixyz++)
    dn[ixyz] = ref_node_xyz(ref_node, ixyz, node) - ideal_location[ixyz];
  for (ixyz = 0; ixyz < 3; ixyz++)
    dt[ixyz] =
        ref_node_xyz(ref_node, ixyz, n1) - ref_node_xyz(ref_node, ixyz, n0);

  tangent_length = ref_math_dot(dt, dt);
  projection = ref_math_dot(dn, dt);

  if (ref_math_divisible(projection, tangent_length)) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      dn[ixyz] -= (projection / tangent_length) * dt[ixyz];
  } else {
    printf("projection = %e tangent_length = %e\n", projection, tangent_length);
    return REF_DIV_ZERO;
  }

  RSS(ref_math_normalize(dn), "normalize direction");

  /* averaged metric */
  RSS(ref_node_metric_get_log(ref_node, n0, log_m0), "get n0 log m");
  RSS(ref_node_metric_get_log(ref_node, n1, log_m1), "get n1 log m");
  RSS(ref_node_metric_get_log(ref_node, node, log_m2), "get node log m");
  for (i = 0; i < 6; i++) log_m[i] = (log_m0[i] + log_m1[i] + log_m2[i]) / 3.0;
  RSS(ref_matrix_exp_m(log_m, m), "exp avg");

  length_in_metric = ref_matrix_sqrt_vt_m_v(m, dn);

  scale = 0.5 * sqrt(3.0); /* altitude of equilateral triangle */
  if (ref_math_divisible(scale, length_in_metric)) {
    scale = scale / length_in_metric;
  } else {
    printf(" length_in_metric = %e, not invertible\n", length_in_metric);
    return REF_DIV_ZERO;
  }

  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] += scale * dn[ixyz];

  return REF_SUCCESS;
}